

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var.c
# Opt level: O1

var * varcontent(GlobalConfig *global,char *name,size_t nlen)

{
  var *pvVar1;
  int iVar2;
  size_t sVar3;
  
  pvVar1 = global->variables;
  while( true ) {
    if (pvVar1 == (var *)0x0) {
      return (var *)0x0;
    }
    sVar3 = strlen(pvVar1->name);
    if ((sVar3 == nlen) && (iVar2 = strncmp(name,pvVar1->name,nlen), iVar2 == 0)) break;
    pvVar1 = pvVar1->next;
  }
  return pvVar1;
}

Assistant:

static const struct var *varcontent(struct GlobalConfig *global,
                                    const char *name, size_t nlen)
{
  struct var *list = global->variables;
  while(list) {
    if((strlen(list->name) == nlen) &&
       !strncmp(name, list->name, nlen)) {
      return list;
    }
    list = list->next;
  }
  return NULL;
}